

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnBrIfExpr(BinaryReaderInterp *this,Index depth)

{
  Result RVar1;
  Offset fixup_offset;
  Enum EVar2;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  Index local_bc;
  Location local_b8;
  Location local_98;
  Var local_70;
  
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset = local_b8.field_1.field_1.offset;
  Var::Var(&local_70,depth,&local_b8);
  RVar1 = SharedValidator::OnBrIf(&this->validator_,&local_98,&local_70);
  Var::~Var(&local_70);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = GetBrDropKeepCount(this,depth,(Index *)&local_98,(Index *)&local_b8);
    if (RVar1.enum_ != Error) {
      RVar1 = TypeChecker::GetCatchCount(&(this->validator_).typechecker_,depth,&local_bc);
      if (RVar1.enum_ != Error) {
        Istream::Emit(this->istream_,InterpBrUnless);
        fixup_offset = Istream::EmitFixupU32(this->istream_);
        EmitBr(this,depth,(Index)local_98.filename._M_len,(Index)local_b8.filename._M_len,local_bc);
        Istream::ResolveFixupU32(this->istream_,fixup_offset);
        EVar2 = Ok;
      }
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnBrIfExpr(Index depth) {
  Index drop_count, keep_count, catch_drop_count;
  CHECK_RESULT(validator_.OnBrIf(GetLocation(), Var(depth, GetLocation())));
  CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
  CHECK_RESULT(validator_.GetCatchCount(depth, &catch_drop_count));
  // Flip the br_if so if <cond> is true it can drop values from the stack.
  istream_.Emit(Opcode::InterpBrUnless);
  auto fixup = istream_.EmitFixupU32();
  EmitBr(depth, drop_count, keep_count, catch_drop_count);
  istream_.ResolveFixupU32(fixup);
  return Result::Ok;
}